

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O1

Rwt_Node_t * Rwt_ManAddVar(Rwt_Man_t *p,uint uTruth,int fPrecompute)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Rwt_Node_t *pRVar3;
  Rwt_Node_t **ppRVar4;
  Rwt_Node_t *pRVar5;
  void **ppvVar6;
  Rwt_Node_t **ppRVar7;
  int iVar8;
  
  pRVar5 = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pRVar5->Id = p->vForest->nSize;
  pRVar5->TravId = 0;
  *(uint *)&pRVar5->field_0x8 = uTruth & 0xffff | 0x40000000;
  pRVar5->p0 = (Rwt_Node_t *)0x0;
  pRVar5->p1 = (Rwt_Node_t *)0x0;
  pRVar5->pNext = (Rwt_Node_t *)0x0;
  pVVar2 = p->vForest;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_0049d812;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar8;
  }
LAB_0049d812:
  iVar8 = pVVar2->nSize;
  pVVar2->nSize = iVar8 + 1;
  pVVar2->pArray[iVar8] = pRVar5;
  if (fPrecompute != 0) {
    ppRVar4 = p->pTable + uTruth;
    do {
      ppRVar7 = ppRVar4;
      pRVar3 = *ppRVar7;
      ppRVar4 = &pRVar3->pNext;
    } while (pRVar3 != (Rwt_Node_t *)0x0);
    *ppRVar7 = pRVar5;
  }
  return pRVar5;
}

Assistant:

Rwt_Node_t * Rwt_ManAddVar( Rwt_Man_t * p, unsigned uTruth, int fPrecompute )
{
    Rwt_Node_t * pNew;
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = 0;
    pNew->Volume = 0;
    pNew->fUsed  = 1;
    pNew->fExor  = 0;
    pNew->p0     = NULL;
    pNew->p1     = NULL;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    if ( fPrecompute )
        Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}